

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_quaternion rf_quaternion_slerp(rf_quaternion q1,rf_quaternion q2,float amount)

{
  double dVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined8 uVar13;
  float fVar14;
  rf_quaternion rVar15;
  
  fVar7 = q2.z;
  fVar9 = q2.w;
  fVar3 = q2.x;
  fVar6 = q2.y;
  fVar11 = q1.x;
  fVar12 = q1.y;
  fVar8 = q1.z;
  fVar10 = q1.w;
  uVar13 = q1._8_8_;
  fVar14 = fVar10 * fVar9 + fVar8 * fVar7 + fVar11 * fVar3 + fVar12 * fVar6;
  if (ABS((double)fVar14) < 1.0) {
    if (fVar14 <= 0.95) {
      dVar1 = acos((double)fVar14);
      fVar14 = 1.0 - fVar14 * fVar14;
      if (fVar14 < 0.0) {
        fVar14 = sqrtf(fVar14);
      }
      else {
        fVar14 = SQRT(fVar14);
      }
      if (0.001 <= ABS(fVar14)) {
        fVar4 = sinf((1.0 - amount) * (float)dVar1);
        fVar4 = fVar4 / fVar14;
        fVar5 = sinf((float)dVar1 * amount);
        fVar5 = fVar5 / fVar14;
        fVar11 = fVar11 * fVar4 + fVar3 * fVar5;
        fVar12 = fVar12 * fVar4 + fVar6 * fVar5;
        uVar13 = CONCAT44(fVar10 * fVar4 + fVar5 * fVar9,fVar8 * fVar4 + fVar5 * fVar7);
      }
      else {
        fVar11 = fVar11 * 0.5 + fVar3 * 0.5;
        fVar12 = fVar12 * 0.5 + fVar6 * 0.5;
        uVar13 = CONCAT44(fVar10 * 0.5 + fVar9 * 0.5,fVar8 * 0.5 + fVar7 * 0.5);
      }
    }
    else {
      fVar8 = (fVar7 - fVar8) * amount + fVar8;
      fVar10 = (fVar9 - fVar10) * amount + fVar10;
      fVar11 = amount * (fVar3 - fVar11) + fVar11;
      fVar12 = amount * (fVar6 - fVar12) + fVar12;
      fVar3 = SQRT(fVar10 * fVar10 + fVar8 * fVar8 + fVar11 * fVar11 + fVar12 * fVar12);
      uVar2 = -(uint)(fVar3 == 0.0);
      fVar3 = (float)(uVar2 & 0x3f800000 | ~uVar2 & (uint)(1.0 / fVar3));
      fVar11 = fVar11 * fVar3;
      fVar12 = fVar12 * fVar3;
      uVar13 = CONCAT44(fVar3 * fVar10,fVar3 * fVar8);
    }
  }
  rVar15.y = fVar12;
  rVar15.x = fVar11;
  rVar15.z = (float)(int)uVar13;
  rVar15.w = (float)(int)((ulong)uVar13 >> 0x20);
  return rVar15;
}

Assistant:

RF_API rf_quaternion rf_quaternion_slerp(rf_quaternion q1, rf_quaternion q2, float amount)
{
    rf_quaternion result = {0};

    float cosHalfTheta = q1.x * q2.x + q1.y * q2.y + q1.z * q2.z + q1.w * q2.w;

    if (fabs(cosHalfTheta) >= 1.0f) result = q1;
    else if (cosHalfTheta > 0.95f) result = rf_quaternion_nlerp(q1, q2, amount);
    else
    {
        float halfTheta = (float) acos(cosHalfTheta);
        float sinHalfTheta = (float) sqrt(1.0f - cosHalfTheta * cosHalfTheta);

        if (fabs(sinHalfTheta) < 0.001f)
        {
            result.x = (q1.x * 0.5f + q2.x * 0.5f);
            result.y = (q1.y * 0.5f + q2.y * 0.5f);
            result.z = (q1.z * 0.5f + q2.z * 0.5f);
            result.w = (q1.w * 0.5f + q2.w * 0.5f);
        } else
        {
            float ratioA = sinf((1 - amount) * halfTheta) / sinHalfTheta;
            float ratioB = sinf(amount * halfTheta) / sinHalfTheta;

            result.x = (q1.x * ratioA + q2.x * ratioB);
            result.y = (q1.y * ratioA + q2.y * ratioB);
            result.z = (q1.z * ratioA + q2.z * ratioB);
            result.w = (q1.w * ratioA + q2.w * ratioB);
        }
    }

    return result;
}